

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc_ball.cpp
# Opt level: O0

void __thiscall lumeview::ArcBall::ArcBall(ArcBall *this)

{
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  ArcBall *local_10;
  ArcBall *this_local;
  
  local_14 = 1.0;
  local_18 = 0.0;
  local_1c = 0.0;
  local_20 = 0.0;
  local_10 = this;
  glm::tquat<float,_(glm::precision)0>::tquat
            (&this->m_rotQuat,&local_14,&local_18,&local_1c,&local_20);
  glm::tquat<float,_(glm::precision)0>::tquat(&this->m_beginDragQuat);
  glm::tvec3<float,_(glm::precision)0>::tvec3(&this->m_beginDragPos);
  glm::tvec2<float,_(glm::precision)0>::tvec2(&this->m_frame,1.0,1.0);
  glm::tvec2<float,_(glm::precision)0>::tvec2(&this->m_offset,0.0,0.0);
  glm::tvec2<float,_(glm::precision)0>::tvec2(&this->m_lastMousePos);
  this->m_radius = 1.0;
  this->m_dragging = false;
  return;
}

Assistant:

ArcBall::ArcBall() :
	m_rotQuat (1.f, 0.f, 0.f, 0.f), // w = 1, rest 0
	m_frame (1.f, 1.f),
	m_offset (0.f, 0.f),
	m_radius (1.f),
	m_dragging (false)
{
}